

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall QtMWidgets::ScrollIndicator::paintEvent(ScrollIndicator *this,QPaintEvent *param_1)

{
  QPainter p;
  QPainter local_10 [8];
  
  QPainter::QPainter(local_10,(QPaintDevice *)&this->field_0x10);
  if ((this->policy == ScrollIndicatorAlwaysOn) ||
     ((this->policy == ScrollIndicatorAsNeeded && (this->needPaint == true)))) {
    drawIndicator(this,local_10,&this->color);
  }
  QPainter::~QPainter(local_10);
  return;
}

Assistant:

void
ScrollIndicator::paintEvent( QPaintEvent * )
{
	QPainter p( this );

	switch( policy )
	{
		case AbstractScrollArea::ScrollIndicatorAsNeeded :
			if( !needPaint )
				break;
			[[fallthrough]];
		case AbstractScrollArea::ScrollIndicatorAlwaysOn :
			drawIndicator( &p, color );
		break;

		default:
			break;
	}
}